

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O0

void __thiscall QTableView::setSelectionModel(QTableView *this,QItemSelectionModel *selectionModel)

{
  bool bVar1;
  QTableViewPrivate *pQVar2;
  undefined8 in_RSI;
  Connection *in_RDI;
  long in_FS_OFFSET;
  Object *unaff_retaddr;
  QTableViewPrivate *d;
  QAbstractItemView *in_stack_00000038;
  ConnectionType in_stack_00000040;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffffac;
  Connection in_stack_fffffffffffffff0;
  ContextType *context;
  
  context = *(ContextType **)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QTableView *)0x8b5f4f);
  bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QItemSelectionModel> *)0x8b5f65);
  if (bVar1) {
    QObject::disconnect(&pQVar2->selectionmodelConnection);
  }
  (**(code **)(*(long *)&(pQVar2->verticalHeader->super_QAbstractItemView).super_QAbstractScrollArea
                         .super_QFrame.super_QWidget + 0x1d0))(pQVar2->verticalHeader,in_RSI);
  (**(code **)(*(long *)&(pQVar2->horizontalHeader->super_QAbstractItemView).
                         super_QAbstractScrollArea.super_QFrame.super_QWidget + 0x1d0))
            (pQVar2->horizontalHeader,in_RSI);
  QAbstractItemView::setSelectionModel(in_stack_00000038,(QItemSelectionModel *)this);
  bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QItemSelectionModel> *)0x8b5fd0);
  if (bVar1) {
    ::QPointer::operator_cast_to_QItemSelectionModel_((QPointer<QItemSelectionModel> *)0x8b5fea);
    uVar3 = 0;
    QObject::
    connect<void(QItemSelectionModel::*)(QModelIndex_const&,QModelIndex_const&),bool(QAbstractItemModel::*)()>
              (unaff_retaddr,(offset_in_QItemSelectionModel_to_subr)d,context,
               (offset_in_QAbstractItemModel_to_subr *)in_stack_fffffffffffffff0.d_ptr,
               in_stack_00000040);
    QMetaObject::Connection::operator=
              (in_RDI,(Connection *)CONCAT44(in_stack_ffffffffffffffac,uVar3));
    QMetaObject::Connection::~Connection((Connection *)&stack0xfffffffffffffff0);
  }
  if (*(ContextType **)(in_FS_OFFSET + 0x28) != context) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTableView::setSelectionModel(QItemSelectionModel *selectionModel)
{
    Q_D(QTableView);
    Q_ASSERT(selectionModel);
    if (d->selectionModel) {
        // support row editing
        disconnect(d->selectionmodelConnection);
    }

    d->verticalHeader->setSelectionModel(selectionModel);
    d->horizontalHeader->setSelectionModel(selectionModel);
    QAbstractItemView::setSelectionModel(selectionModel);

    if (d->selectionModel) {
        // support row editing
        d->selectionmodelConnection =
            connect(d->selectionModel, &QItemSelectionModel::currentRowChanged,
                    d->model, &QAbstractItemModel::submit);
    }
}